

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InversePowerSeriesInteractionType.hpp
# Opt level: O2

void __thiscall
OpenMD::InversePowerSeriesInteractionType::~InversePowerSeriesInteractionType
          (InversePowerSeriesInteractionType *this)

{
  (this->super_NonBondedInteractionType)._vptr_NonBondedInteractionType =
       (_func_int **)&PTR__InversePowerSeriesInteractionType_00279578;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->coefficients).super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->powers).super__Vector_base<int,_std::allocator<int>_>);
  NonBondedInteractionType::~NonBondedInteractionType(&this->super_NonBondedInteractionType);
  return;
}

Assistant:

InversePowerSeriesInteractionType(
        std::vector<std::pair<int, RealType>> series) {
      powers.clear();
      coefficients.clear();

      std::vector<std::pair<int, RealType>>::iterator it;

      for (it = series.begin(); it != series.end(); ++it) {
        powers.push_back((*it).first);
        coefficients.push_back((*it).second);
      }

      setInversePowerSeries();
    }